

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noproxy.c
# Opt level: O3

_Bool Curl_check_noproxy(char *name,char *no_proxy)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  char *pcVar4;
  ulong uVar5;
  int iVar6;
  size_t __n;
  long lVar7;
  long lVar8;
  size_t sVar9;
  char cVar10;
  uint uVar11;
  char *pcVar12;
  char cVar13;
  bool bVar14;
  uchar address_1 [16];
  char checkip [128];
  char hostip [128];
  char local_170;
  uint local_168 [4];
  uint local_158 [6];
  ulong local_140;
  char local_138 [128];
  char local_b8 [136];
  
  if (name == (char *)0x0) {
    return false;
  }
  if (no_proxy == (char *)0x0 || *name == '\0') {
    return false;
  }
  bVar2 = *no_proxy;
  if (bVar2 == 0) {
    return false;
  }
  if (bVar2 == 0x2a) {
    iVar6 = -(uint)(byte)no_proxy[1];
  }
  else {
    iVar6 = 0x2a - (uint)bVar2;
  }
  if (iVar6 == 0) {
    return true;
  }
  if (*name == '[') {
    pcVar4 = strchr(name,0x5d);
    if (pcVar4 == (char *)0x0) {
      return false;
    }
    pcVar12 = name + 1;
    sVar9 = (long)pcVar4 - (long)pcVar12;
    if (0x7f < sVar9) {
      return false;
    }
    name = local_b8;
    memcpy(name,pcVar12,sVar9);
    local_b8[sVar9] = '\0';
    cVar13 = '\x02';
  }
  else {
    sVar9 = strlen(name);
    iVar6 = inet_pton(2,name,local_b8);
    cVar13 = iVar6 == 1;
    if (!(bool)cVar13) {
      sVar9 = sVar9 - (name[sVar9 - 1] == '.');
    }
    bVar2 = *no_proxy;
    if (bVar2 == 0) {
      return false;
    }
  }
  uVar5 = (ulong)bVar2;
  local_140 = sVar9;
  do {
    while ((cVar10 = (char)uVar5, cVar10 == '\t' || ((int)uVar5 == 0x20))) {
      pbVar1 = (byte *)(no_proxy + 1);
      no_proxy = no_proxy + 1;
      uVar5 = (ulong)*pbVar1;
    }
    sVar9 = 0xffffffffffffffff;
    lVar7 = 0;
    while ((0x2c < (byte)uVar5 || ((0x100100000201U >> (uVar5 & 0x3f) & 1) == 0))) {
      lVar8 = sVar9 + 2;
      lVar7 = lVar7 + -1;
      sVar9 = sVar9 + 1;
      uVar5 = (ulong)(byte)no_proxy[lVar8];
    }
    if (lVar7 != 0) {
      __n = -lVar7;
      if (cVar13 == '\0') {
        if (no_proxy[sVar9] == '.') {
          __n = sVar9;
        }
        pcVar4 = no_proxy;
        if (__n == 0) {
          __n = 0;
        }
        else if (cVar10 == '.') {
          __n = __n - 1;
          pcVar4 = no_proxy + 1;
        }
        lVar8 = local_140 - __n;
        uVar5 = local_140;
        pcVar12 = name;
        if (lVar8 != 0) {
          if ((local_140 < __n || lVar8 == 0) || (name[lVar8 + -1] != '.')) goto LAB_00147766;
          uVar5 = __n;
          pcVar12 = name + lVar8;
        }
        iVar6 = curl_strnequal(pcVar4,pcVar12,uVar5);
        if (iVar6 != 0) {
          return true;
        }
      }
      else if (__n < 0x80) {
        memcpy(local_138,no_proxy,__n);
        local_138[sVar9 + 1] = '\0';
        pcVar4 = strchr(local_138,0x2f);
        if (pcVar4 == (char *)0x0) {
          if (cVar13 == '\x02') {
LAB_00147607:
            bVar14 = false;
            uVar11 = 0x10;
            uVar3 = 0x80;
            local_170 = '\0';
LAB_00147623:
            iVar6 = inet_pton(10,name,local_158);
            if (((iVar6 == 1) && (iVar6 = inet_pton(10,local_138,local_168), iVar6 == 1)) &&
               ((uVar5 = (ulong)uVar11, uVar3 < 8 ||
                (iVar6 = bcmp(local_158,local_168,uVar5), iVar6 == 0)))) {
              if (!bVar14) {
                return true;
              }
              if ((byte)((*(byte *)((long)local_168 + uVar5) ^ *(byte *)((long)local_158 + uVar5))
                        >> (8U - local_170 & 0x1f)) != 0) {
                return true;
              }
            }
          }
          else {
            uVar3 = 0;
LAB_0014770c:
            local_158[0] = 0;
            local_168[0] = 0;
            iVar6 = inet_pton(2,name,local_158);
            if ((iVar6 == 1) && (iVar6 = inet_pton(2,local_138,local_168), iVar6 == 1)) {
              if ((uVar3 & 0x1f) == 0) {
                bVar14 = local_158[0] == local_168[0];
              }
              else {
                uVar11 = local_168[0] ^ local_158[0];
                bVar14 = (uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                         uVar11 << 0x18) >> (-(char)uVar3 & 0x1fU) == 0;
              }
              if (bVar14) {
                return true;
              }
            }
          }
        }
        else {
          uVar3 = atoi(pcVar4 + 1);
          *pcVar4 = '\0';
          if (cVar13 == '\x02') {
            if (uVar3 == 0) goto LAB_00147607;
            if (uVar3 < 0x88) {
              uVar11 = uVar3 >> 3;
              local_170 = (char)(uVar3 & 7);
              bVar14 = (uVar3 & 7) != 0;
              if (uVar11 != 0x10 || !bVar14) goto LAB_00147623;
            }
          }
          else {
            local_158[0] = 0;
            local_168[0] = 0;
            if (uVar3 < 0x21) goto LAB_0014770c;
          }
        }
      }
    }
LAB_00147766:
    for (no_proxy = no_proxy + -lVar7; (cVar10 = *no_proxy, cVar10 == '\t' || (cVar10 == ' '));
        no_proxy = no_proxy + 1) {
    }
    if (cVar10 != ',') {
      return false;
    }
    do {
      bVar2 = no_proxy[1];
      uVar5 = (ulong)bVar2;
      no_proxy = no_proxy + 1;
    } while (bVar2 == 0x2c);
    if (bVar2 == 0) {
      return false;
    }
  } while( true );
}

Assistant:

bool Curl_check_noproxy(const char *name, const char *no_proxy)
{
  char hostip[128];

  /*
   * If we do not have a hostname at all, like for example with a FILE
   * transfer, we have nothing to interrogate the noproxy list with.
   */
  if(!name || name[0] == '\0')
    return FALSE;

  /* no_proxy=domain1.dom,host.domain2.dom
   *   (a comma-separated list of hosts which should
   *   not be proxied, or an asterisk to override
   *   all proxy variables)
   */
  if(no_proxy && no_proxy[0]) {
    const char *p = no_proxy;
    size_t namelen;
    enum nametype type = TYPE_HOST;
    if(!strcmp("*", no_proxy))
      return TRUE;

    /* NO_PROXY was specified and it was not just an asterisk */

    if(name[0] == '[') {
      char *endptr;
      /* IPv6 numerical address */
      endptr = strchr(name, ']');
      if(!endptr)
        return FALSE;
      name++;
      namelen = endptr - name;
      if(namelen >= sizeof(hostip))
        return FALSE;
      memcpy(hostip, name, namelen);
      hostip[namelen] = 0;
      name = hostip;
      type = TYPE_IPV6;
    }
    else {
      unsigned int address;
      namelen = strlen(name);
      if(1 == Curl_inet_pton(AF_INET, name, &address))
        type = TYPE_IPV4;
      else {
        /* ignore trailing dots in the hostname */
        if(name[namelen - 1] == '.')
          namelen--;
      }
    }

    while(*p) {
      const char *token;
      size_t tokenlen = 0;
      bool match = FALSE;

      /* pass blanks */
      while(*p && ISBLANK(*p))
        p++;

      token = p;
      /* pass over the pattern */
      while(*p && !ISBLANK(*p) && (*p != ',')) {
        p++;
        tokenlen++;
      }

      if(tokenlen) {
        switch(type) {
        case TYPE_HOST:
          /* ignore trailing dots in the token to check */
          if(token[tokenlen - 1] == '.')
            tokenlen--;

          if(tokenlen && (*token == '.')) {
            /* ignore leading token dot as well */
            token++;
            tokenlen--;
          }
          /* A: example.com matches 'example.com'
             B: www.example.com matches 'example.com'
             C: nonexample.com DOES NOT match 'example.com'
          */
          if(tokenlen == namelen)
            /* case A, exact match */
            match = strncasecompare(token, name, namelen);
          else if(tokenlen < namelen) {
            /* case B, tailmatch domain */
            match = (name[namelen - tokenlen - 1] == '.') &&
              strncasecompare(token, name + (namelen - tokenlen),
                              tokenlen);
          }
          /* case C passes through, not a match */
          break;
        case TYPE_IPV4:
        case TYPE_IPV6: {
          const char *check = token;
          char *slash;
          unsigned int bits = 0;
          char checkip[128];
          if(tokenlen >= sizeof(checkip))
            /* this cannot match */
            break;
          /* copy the check name to a temp buffer */
          memcpy(checkip, check, tokenlen);
          checkip[tokenlen] = 0;
          check = checkip;

          slash = strchr(check, '/');
          /* if the slash is part of this token, use it */
          if(slash) {
            /* if the bits variable gets a crazy value here, that is fine as
               the value will then be rejected in the cidr function */
            bits = (unsigned int)atoi(slash + 1);
            *slash = 0; /* null terminate there */
          }
          if(type == TYPE_IPV6)
            match = Curl_cidr6_match(name, check, bits);
          else
            match = Curl_cidr4_match(name, check, bits);
          break;
        }
        }
        if(match)
          return TRUE;
      } /* if(tokenlen) */
      /* pass blanks after pattern */
      while(ISBLANK(*p))
        p++;
      /* if not a comma, this ends the loop */
      if(*p != ',')
        break;
      /* pass any number of commas */
      while(*p == ',')
        p++;
    } /* while(*p) */
  } /* NO_PROXY was specified and it was not just an asterisk */

  return FALSE;
}